

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_token.c
# Opt level: O1

void simple_print_token(simple_token *t,unsigned_short depth,char *string)

{
  simple_token *t_00;
  uint uVar1;
  
  if (t == (simple_token *)0x0) {
    return;
  }
  if (depth != 0) {
    uVar1 = (uint)depth;
    do {
      fputc(9,_stderr);
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  if (string == (char *)0x0) {
    fprintf(_stderr,"* (%d) %lu:%lu\n",(ulong)t->type);
  }
  else {
    fprintf(_stderr,"* (%d) %lu:%lu\t\'%.*s\'\n",(ulong)t->type,t->start,t->len,t->len & 0xffffffff,
            string + t->start);
  }
  t_00 = t->child;
  if (t_00 != (simple_token *)0x0) {
    do {
      simple_print_token(t_00,depth + 1,string);
      t_00 = t_00->next;
    } while (t_00 != (simple_token *)0x0);
  }
  return;
}

Assistant:

void simple_print_token(simple_token * t, unsigned short depth, const char * string) {
	if (t != NULL) {
		for (int i = 0; i < depth; ++i) {
			fprintf(stderr, "\t");
		}

		if (string == NULL) {
			fprintf(stderr, "* (%d) %lu:%lu\n", t->type, t->start, t->len);
		} else {
			fprintf(stderr, "* (%d) %lu:%lu\t'%.*s'\n", t->type, t->start, t->len, (int)t->len, &string[t->start]);
		}

		if (t->child != NULL) {
			simple_print_token_tree(t->child, depth + 1, string);
		}
	}
}